

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O2

void __thiscall
LinkedReadsDatastore::dump_tag_occupancy_histogram(LinkedReadsDatastore *this,string *filename)

{
  uint uVar1;
  pair<unsigned_int,_unsigned_int> *t;
  long lVar2;
  ostream *poVar3;
  int i;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  _Stack_13ac0;
  ofstream tohf;
  uint64_t oh [10001];
  
  std::ofstream::ofstream(&tohf,(string *)filename,_S_out);
  for (lVar2 = 0; lVar2 != 0x13888; lVar2 = lVar2 + 8) {
    *(undefined8 *)((long)oh + lVar2) = 0;
  }
  get_tag_readcount((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&_Stack_13ac0,this);
  for (; _Stack_13ac0._M_impl.super__Vector_impl_data._M_start !=
         _Stack_13ac0._M_impl.super__Vector_impl_data._M_finish;
      _Stack_13ac0._M_impl.super__Vector_impl_data._M_start =
           _Stack_13ac0._M_impl.super__Vector_impl_data._M_start + 1) {
    uVar1 = (_Stack_13ac0._M_impl.super__Vector_impl_data._M_start)->second;
    if (9999 < (_Stack_13ac0._M_impl.super__Vector_impl_data._M_start)->second) {
      uVar1 = 10000;
    }
    oh[uVar1] = oh[uVar1] + 1;
  }
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&_Stack_13ac0);
  for (lVar2 = 0; lVar2 != 0x2711; lVar2 = lVar2 + 1) {
    if (oh[lVar2] != 0) {
      poVar3 = (ostream *)std::ostream::operator<<(&tohf,(int)lVar2);
      poVar3 = std::operator<<(poVar3,",");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  std::ofstream::~ofstream(&tohf);
  return;
}

Assistant:

void LinkedReadsDatastore::dump_tag_occupancy_histogram(std::string filename) {
    std::ofstream tohf(filename);
    uint64_t oh[10001];
    for (auto &o:oh) o=0;
    for (auto &t:get_tag_readcount()){
        ++oh[(t.second>10000 ? 10000:t.second)];
    }
    for (auto i=0;i<10001;++i)
        if (oh[i]) tohf<<i<<","<<oh[i]<<std::endl;
}